

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::RevnoParser::ProcessLine(RevnoParser *this)

{
  bool bVar1;
  string local_30;
  RevnoParser *local_10;
  RevnoParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexRevno,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexRevno,1);
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->RegexRevno.find(this->Line))
      {
      this->Rev = this->RegexRevno.match(1);
      }
    return true;
    }